

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O3

void __thiscall CGameClient::OnMessage(CGameClient *this,int MsgId,CUnpacker *pUnpacker)

{
  CNetObjHandler *this_00;
  int *piVar1;
  uint uVar2;
  IClient *pIVar3;
  CComponent *pCVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int *piVar11;
  char *pcVar12;
  _func_int *UNRECOVERED_JUMPTABLE;
  long lVar13;
  char *pcVar14;
  int i_1;
  ulong uVar15;
  char (*pacVar16) [97];
  char (*pacVar17) [97];
  CNetMsg_De_ClientLeave *pCVar18;
  CTuningParams *pCVar19;
  IConsole *pIVar20;
  CSounds *this_01;
  CChat *pCVar21;
  CBroadcast *this_02;
  CNetMsg_Sv_Emoticon *pMsg;
  uint i;
  long lVar22;
  long in_FS_OFFSET;
  byte bVar23;
  float fVar24;
  char aLabel [64];
  char aBuf [256];
  int aParaI [3];
  char local_188 [64];
  CNetMsg_De_ClientLeave local_148;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  uint local_44 [3];
  long local_38;
  
  bVar23 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (*(this->m_pClient->super_IInterface)._vptr_IInterface[9])(this->m_pClient,1);
  if (MsgId != 0x15) {
    if (MsgId == 0xc) {
      iVar6 = CUnpacker::GetInt(pUnpacker);
      if (0 < iVar6) {
        do {
          pcVar14 = CUnpacker::GetString(pUnpacker,2);
          if (pUnpacker->m_Error != 0) goto switchD_00181e92_caseD_5;
          CVoting::AddOption(this->m_pVoting,pcVar14);
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
    }
    else if ((MsgId == 6) && (pIVar3 = this->m_pClient, pIVar3->m_State != 4)) {
      lVar22 = 0;
      (*(pIVar3->super_IInterface)._vptr_IInterface[9])(pIVar3,0);
      local_148.m_pName = (char *)0xc8000003e8;
      local_148.m_ClientID = 0x32;
      local_148._12_4_ = 0x528;
      local_148.m_pReason = (char *)0x1f4000004b0;
      uStack_130 = 0x5f00000096;
      local_128 = 0x1f4000009470;
      uStack_120 = 0x5dc0000012c;
      local_118 = 0xd6d800000032;
      uStack_110 = 0x8c00030d40;
      local_108 = 0x35b600000007d;
      uStack_100 = 0x7d000000c8;
      local_f8 = 0x5000043238;
      uStack_f0 = 0x2bc00000014;
      local_e8 = 0xc8000186a0;
      uStack_e0 = 0x3a9800013880;
      local_d8 = 100;
      uStack_d0 = 0x6400000064;
      do {
        iVar6 = CUnpacker::GetInt(pUnpacker);
        *(int *)((long)&local_148.m_pName + lVar22 * 4) = iVar6;
        lVar22 = lVar22 + 1;
      } while (lVar22 != 0x20);
      if (pUnpacker->m_Error == 0) {
        this->m_ServerMode = 0;
        pCVar18 = &local_148;
        pCVar19 = &this->m_Tuning;
        for (lVar22 = 0x10; lVar22 != 0; lVar22 = lVar22 + -1) {
          *(char **)pCVar19 = pCVar18->m_pName;
          pCVar18 = (CNetMsg_De_ClientLeave *)((long)pCVar18 + ((ulong)bVar23 * -2 + 1) * 8);
          pCVar19 = (CTuningParams *)((long)pCVar19 + (ulong)bVar23 * -0x10 + 8);
        }
      }
      goto switchD_00181e92_caseD_5;
    }
LAB_00181e2a:
    this_00 = &this->m_NetObjHandler;
    piVar11 = (int *)CNetObjHandler::SecureUnpackMsg(this_00,MsgId,pUnpacker);
    if (piVar11 == (int *)0x0) {
      pcVar14 = CNetObjHandler::GetMsgName(this_00,MsgId);
      pcVar12 = CNetObjHandler::FailedMsgOn(this_00);
      str_format((char *)&local_148,0x100,"dropped weird message \'%s\' (%d), failed on \'%s\'",
                 pcVar14,(ulong)(uint)MsgId,pcVar12);
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,1,"client",&local_148,0);
    }
    else {
      if (0 < (this->m_All).m_Num) {
        lVar22 = 0;
        do {
          pCVar4 = (this->m_All).m_paComponents[lVar22];
          (*pCVar4->_vptr_CComponent[0xb])(pCVar4,(ulong)(uint)MsgId,piVar11);
          lVar22 = lVar22 + 1;
        } while (lVar22 < (this->m_All).m_Num);
      }
      switch(MsgId) {
      case 4:
        if (this->m_pClient->m_State != 4) {
          iVar6 = *piVar11;
          lVar22 = (long)iVar6;
          lVar13 = (long)this->m_aClients[lVar22].m_Team;
          if (lVar13 != -1) {
            piVar1 = (this->m_GameInfo).m_aTeamSize + lVar13;
            *piVar1 = *piVar1 + -1;
            iVar6 = *piVar11;
            lVar22 = (long)iVar6;
          }
          iVar10 = piVar11[1];
          this->m_aClients[lVar22].m_Team = iVar10;
          if ((long)iVar10 != -1) {
            piVar1 = (this->m_GameInfo).m_aTeamSize + iVar10;
            *piVar1 = *piVar1 + 1;
            iVar6 = *piVar11;
            lVar22 = (long)iVar6;
          }
          CClientData::UpdateRenderInfo(this->m_aClients + lVar22,this,iVar6,false);
          if (*piVar11 == this->m_LocalClientID) {
            this->m_TeamCooldownTick = piVar11[3];
            this->m_TeamChangeTime = this->m_pClient->m_LocalTime;
          }
        }
        if (piVar11[2] == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            DoTeamChangeMessage(this,this->m_aClients[*piVar11].m_aName,*piVar11,piVar11[1]);
            return;
          }
          goto LAB_00182c8a;
        }
        break;
      case 5:
      case 6:
      case 7:
      case 9:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x15:
        break;
      case 8:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x11])();
          return;
        }
        goto LAB_00182c8a;
      case 10:
        iVar6 = *piVar11;
        this->m_aClients[iVar6].m_Emoticon = piVar11[1];
        this->m_aClients[iVar6].m_EmoticonStart = this->m_pClient->m_CurGameTick;
        break;
      case 0x11:
        pIVar3 = this->m_pClient;
        if (pIVar3->m_State != 4) {
          (*(pIVar3->super_IInterface)._vptr_IInterface[9])(pIVar3,0);
          if ((this->m_ServerSettings).m_TeamLock == false) {
            if (piVar11[3] != 0) {
              pcVar14 = "Teams were locked";
              goto LAB_0018255a;
            }
          }
          else if (piVar11[3] == 0) {
            pcVar14 = "Teams were unlocked";
LAB_0018255a:
            pCVar21 = this->m_pChat;
            pcVar14 = Localize(pcVar14,"");
            CChat::AddLine(pCVar21,pcVar14,-1,0,-1);
          }
          (this->m_ServerSettings).m_KickVote = *piVar11 != 0;
          (this->m_ServerSettings).m_KickMin = piVar11[1];
          (this->m_ServerSettings).m_SpecVote = piVar11[2] != 0;
          (this->m_ServerSettings).m_TeamLock = piVar11[3] != 0;
          (this->m_ServerSettings).m_TeamBalance = piVar11[4] != 0;
          (this->m_ServerSettings).m_PlayerSlots = piVar11[5];
        }
        break;
      case 0x12:
        pIVar3 = this->m_pClient;
        if (pIVar3->m_State != 4) {
          (*(pIVar3->super_IInterface)._vptr_IInterface[9])(pIVar3,0);
          if (piVar11[1] == 0) {
            iVar6 = *piVar11;
            if (this->m_aClients[iVar6].m_Active != true) {
              if ((this->m_LocalClientID != -1) && (piVar11[0x22] == 0)) {
                DoEnterMessage(this,*(char **)(piVar11 + 4),iVar6,piVar11[2]);
                iVar10 = (*(this->m_pDemoRecorder->super_IInterface)._vptr_IInterface[2])();
                iVar6 = *piVar11;
                if ((char)iVar10 != '\0') {
                  local_148.m_pName = *(char **)(piVar11 + 4);
                  local_148._12_4_ = piVar11[2];
                  local_148.m_ClientID = iVar6;
                  IClient::SendPackMsg<CNetMsg_De_ClientEnter>
                            (this->m_pClient,(CNetMsg_De_ClientEnter *)&local_148,0x18);
                  iVar6 = *piVar11;
                }
              }
              goto LAB_00182727;
            }
            if (this->m_pConfig->m_Debug != 0) {
              pIVar20 = this->m_pConsole;
              UNRECOVERED_JUMPTABLE = (pIVar20->super_IInterface)._vptr_IInterface[0x19];
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                pcVar14 = "invalid clientinfo";
                goto LAB_0018268c;
              }
              goto LAB_00182c8a;
            }
          }
          else if (this->m_LocalClientID == -1) {
            iVar6 = *piVar11;
            this->m_LocalClientID = iVar6;
            this->m_TeamChangeTime = this->m_pClient->m_LocalTime;
LAB_00182727:
            this->m_aClients[iVar6].m_Active = true;
            this->m_aClients[iVar6].m_Team = piVar11[2];
            str_utf8_copy_num(this->m_aClients[iVar6].m_aName,*(char **)(piVar11 + 4),0x41,0x10);
            str_utf8_copy_num(this->m_aClients[*piVar11].m_aClan,*(char **)(piVar11 + 6),0x31,0xc);
            this->m_aClients[*piVar11].m_Country = piVar11[8];
            pacVar16 = this->m_aClients[0].m_aaSkinPartNames;
            lVar22 = 0;
            pacVar17 = pacVar16;
            do {
              str_utf8_copy_num((char *)((long)*piVar11 * 0x5b0 + (long)pacVar17),
                                *(char **)((long)piVar11 + lVar22 * 2 + 0x28),0x61,0x18);
              *(undefined4 *)((long)pacVar16 + lVar22 + 0x248 + (long)*piVar11 * 0x5b0) =
                   *(undefined4 *)((long)piVar11 + lVar22 + 0x58);
              *(undefined4 *)((long)pacVar16 + lVar22 + 0x260 + (long)*piVar11 * 0x5b0) =
                   *(undefined4 *)((long)piVar11 + lVar22 + 0x70);
              lVar22 = lVar22 + 4;
              pacVar17 = pacVar17 + 1;
            } while (lVar22 != 0x18);
            iVar10 = (*(this->m_pFriends->super_IInterface)._vptr_IInterface[6])
                               (this->m_pFriends,this->m_aClients + *piVar11,
                                this->m_aClients[*piVar11].m_aClan,1);
            iVar6 = *piVar11;
            this->m_aClients[iVar6].m_Friend = SUB41(iVar10,0);
            iVar10 = (*(this->m_pBlacklist->super_IInterface)._vptr_IInterface[3])
                               (this->m_pBlacklist,this->m_aClients + iVar6,
                                this->m_aClients[iVar6].m_aClan,1);
            iVar6 = *piVar11;
            lVar22 = (long)iVar6;
            this->m_aClients[lVar22].m_ChatIgnore = SUB41(iVar10,0);
            if (SUB41(iVar10,0) != false) {
              GetPlayerLabel(this,local_188,0x40,iVar6,this->m_aClients[lVar22].m_aName);
              pcVar14 = Localize("%s is muted by you","");
              str_format((char *)&local_148,0x80,pcVar14);
              CChat::AddLine(this->m_pChat,(char *)&local_148,-2,0,-1);
              iVar6 = *piVar11;
              lVar22 = (long)iVar6;
            }
            CClientData::UpdateRenderInfo(this->m_aClients + lVar22,this,iVar6,true);
            piVar1 = &(this->m_GameInfo).m_NumPlayers;
            *piVar1 = *piVar1 + 1;
            iVar6 = *piVar11;
            lVar22 = (long)this->m_aClients[iVar6].m_Team;
            if (lVar22 != -1) {
              piVar1 = (this->m_GameInfo).m_aTeamSize + lVar22;
              *piVar1 = *piVar1 + 1;
              iVar6 = *piVar11;
            }
            CStats::OnPlayerEnter(this->m_pStats,iVar6,piVar11[2]);
          }
          else if (this->m_pConfig->m_Debug != 0) {
            pIVar20 = this->m_pConsole;
            UNRECOVERED_JUMPTABLE = (pIVar20->super_IInterface)._vptr_IInterface[0x19];
            if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00182c8a;
            pcVar14 = "invalid local clientinfo";
            goto LAB_0018268c;
          }
        }
        break;
      case 0x13:
        pIVar3 = this->m_pClient;
        if (pIVar3->m_State != 4) {
          (*(pIVar3->super_IInterface)._vptr_IInterface[9])(pIVar3,0);
          iVar6 = piVar11[1];
          iVar10 = piVar11[2];
          iVar5 = piVar11[3];
          (this->m_GameInfo).m_GameFlags = piVar11[0];
          (this->m_GameInfo).m_ScoreLimit = iVar6;
          (this->m_GameInfo).m_TimeLimit = iVar10;
          (this->m_GameInfo).m_MatchNum = iVar5;
          (this->m_GameInfo).m_MatchCurrent = piVar11[4];
        }
        break;
      case 0x14:
        pIVar3 = this->m_pClient;
        if (pIVar3->m_State != 4) {
          (*(pIVar3->super_IInterface)._vptr_IInterface[9])(pIVar3,0);
          iVar6 = *piVar11;
          if (this->m_LocalClientID != iVar6) {
            lVar22 = (long)iVar6;
            if (this->m_aClients[lVar22].m_Active != false) {
              if (piVar11[4] == 0) {
                DoLeaveMessage(this,this->m_aClients[lVar22].m_aName,iVar6,*(char **)(piVar11 + 2));
                local_148.m_pName = this->m_aClients[*piVar11].m_aName;
                local_148.m_ClientID = *piVar11;
                local_148.m_pReason = *(char **)(piVar11 + 2);
                IClient::SendPackMsg<CNetMsg_De_ClientLeave>(this->m_pClient,&local_148,0x18);
                iVar6 = *piVar11;
                lVar22 = (long)iVar6;
              }
              piVar1 = &(this->m_GameInfo).m_NumPlayers;
              *piVar1 = *piVar1 + -1;
              lVar22 = (long)this->m_aClients[lVar22].m_Team;
              if (lVar22 != -1) {
                piVar1 = (this->m_GameInfo).m_aTeamSize + lVar22;
                *piVar1 = *piVar1 + -1;
                iVar6 = *piVar11;
              }
              CClientData::Reset(this->m_aClients + iVar6,this,iVar6);
              CStats::OnPlayerLeave(this->m_pStats,*piVar11);
              break;
            }
          }
          if (this->m_pConfig->m_Debug != 0) {
            pIVar20 = this->m_pConsole;
            UNRECOVERED_JUMPTABLE = (pIVar20->super_IInterface)._vptr_IInterface[0x19];
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              pcVar14 = "invalid clientdrop";
LAB_0018268c:
              (*UNRECOVERED_JUMPTABLE)(pIVar20,1,"client",pcVar14,0);
              return;
            }
            goto LAB_00182c8a;
          }
        }
        break;
      case 0x16:
        if (this->m_pClient->m_State == 4) {
          DoEnterMessage(this,*(char **)piVar11,piVar11[2],piVar11[3]);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            CStats::OnPlayerEnter(this->m_pStats,piVar11[2],piVar11[3]);
            return;
          }
          goto LAB_00182c8a;
        }
        break;
      case 0x17:
        if (this->m_pClient->m_State == 4) {
          DoLeaveMessage(this,*(char **)piVar11,piVar11[2],*(char **)(piVar11 + 4));
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            CStats::OnPlayerLeave(this->m_pStats,piVar11[2]);
            return;
          }
          goto LAB_00182c8a;
        }
        break;
      default:
        if ((MsgId == 0x21) && (pIVar3 = this->m_pClient, pIVar3->m_State != 4)) {
          (*(pIVar3->super_IInterface)._vptr_IInterface[9])(pIVar3,0);
          if (this->m_aClients[*piVar11].m_Active == true) {
            pacVar17 = this->m_aClients[0].m_aaSkinPartNames;
            lVar22 = 0;
            pacVar16 = pacVar17;
            do {
              str_utf8_copy_num((char *)((long)*piVar11 * 0x5b0 + (long)pacVar16),
                                *(char **)((long)piVar11 + lVar22 * 2 + 8),0x61,0x18);
              *(undefined4 *)((long)pacVar17 + lVar22 + 0x248 + (long)*piVar11 * 0x5b0) =
                   *(undefined4 *)((long)piVar11 + lVar22 + 0x38);
              *(undefined4 *)((long)pacVar17 + lVar22 + 0x260 + (long)*piVar11 * 0x5b0) =
                   *(undefined4 *)((long)piVar11 + lVar22 + 0x50);
              lVar22 = lVar22 + 4;
              pacVar16 = pacVar16 + 1;
            } while (lVar22 != 0x18);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              CClientData::UpdateRenderInfo(this->m_aClients + *piVar11,this,*piVar11,true);
              return;
            }
            goto LAB_00182c8a;
          }
          if (this->m_pConfig->m_Debug != 0) {
            pIVar20 = this->m_pConsole;
            UNRECOVERED_JUMPTABLE = (pIVar20->super_IInterface)._vptr_IInterface[0x19];
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              pcVar14 = "invalid skin info";
              goto LAB_0018268c;
            }
            goto LAB_00182c8a;
          }
        }
      }
    }
    goto switchD_00181e92_caseD_5;
  }
  uVar7 = CUnpacker::GetInt(pUnpacker);
  if (10 < uVar7) goto switchD_00181e92_caseD_5;
  uVar2 = gs_GameMsgList[uVar7].m_ParaType;
  uVar8 = uVar2 - 4;
  if (0xfffffffc < uVar8) {
    uVar15 = 0;
    do {
      uVar9 = CUnpacker::GetInt(pUnpacker);
      local_44[uVar15] = uVar9;
      uVar15 = uVar15 + 1;
    } while (uVar2 != uVar15);
  }
  if (pUnpacker->m_Error != 0) goto switchD_00181e92_caseD_5;
  iVar6 = gs_GameMsgList[uVar7].m_Action;
  if (iVar6 != 2) {
    if (uVar8 < 0xfffffffd) {
      pcVar14 = Localize(gs_GameMsgList[uVar7].m_pText,"");
    }
    else {
      pcVar14 = "";
    }
    if (iVar6 == 1) {
      CBroadcast::DoClientBroadcast(this->m_pBroadcast,pcVar14);
    }
    else if (iVar6 == 0) {
      CChat::AddLine(this->m_pChat,pcVar14,-1,0,-1);
    }
    goto LAB_00181e2a;
  }
  if (6 < uVar7 - 4) goto switchD_00181e92_caseD_5;
  uVar2 = (this->m_GameInfo).m_GameFlags;
  switch(uVar7) {
  case 4:
    this_01 = this->m_pSounds;
    iVar6 = 0x23;
    break;
  case 5:
    this_01 = this->m_pSounds;
    iVar6 = 0x24;
    break;
  case 6:
    if ((uVar2 & 1) == 0) {
      pcVar12 = "All players were moved to the spectators";
      if (local_44[0] == 0) {
        pcVar12 = "All players were moved to the game";
      }
    }
    else {
      pcVar14 = "All players were moved to the spectators";
      if (local_44[0] == 1) {
        pcVar14 = "All players were moved to the blue team";
      }
      pcVar12 = "All players were moved to the red team";
      if (local_44[0] != 0) {
        pcVar12 = pcVar14;
      }
    }
    pcVar14 = Localize(pcVar12,"");
    this_02 = this->m_pBroadcast;
    goto LAB_00182c80;
  case 7:
    pcVar14 = "";
    if ((uVar2 & 1) != 0) {
      if (local_44[0] == 0) {
        pcVar14 = "You were moved to the red team due to team balancing";
      }
      else {
        if (local_44[0] != 1) goto LAB_00182c79;
        pcVar14 = "You were moved to the blue team due to team balancing";
      }
      pcVar14 = Localize(pcVar14,"");
    }
LAB_00182c79:
    this_02 = this->m_pBroadcast;
LAB_00182c80:
    CBroadcast::DoClientBroadcast(this_02,pcVar14);
    goto switchD_00181e92_caseD_5;
  case 8:
    if (((long)this->m_LocalClientID == -1) ||
       ((uVar7 = this->m_aClients[this->m_LocalClientID].m_Team, uVar7 == local_44[0] &&
        (((this->m_Snap).m_SpecInfo.m_Active != true ||
         ((((lVar22 = (long)(this->m_Snap).m_SpecInfo.m_SpectatorID, lVar22 == -1 ||
            (this->m_aClients[lVar22].m_Team == uVar7)) &&
           (iVar6 = (this->m_Snap).m_SpecInfo.m_SpecMode, uVar7 == 0 || iVar6 != 2)) &&
          (uVar7 == 1 || iVar6 != 3)))))))) {
      this_01 = this->m_pSounds;
      iVar6 = 0x26;
    }
    else {
      this_01 = this->m_pSounds;
      iVar6 = 0x25;
    }
    break;
  case 9:
    CSounds::Enqueue(this->m_pSounds,3,0x27);
    uVar7 = 0x3f;
    if ((int)local_44[1] < 0x3f) {
      uVar7 = local_44[1];
    }
    uVar15 = 0;
    if (0 < (int)uVar7) {
      uVar15 = (ulong)uVar7;
    }
    CStats::OnFlagCapture(this->m_pStats,(int)uVar15);
    GetPlayerLabel(this,local_188,0x40,(int)uVar15,this->m_aClients[uVar15].m_aName);
    fVar24 = (float)(int)local_44[2] / (float)this->m_pClient->m_GameTickSpeed;
    if (fVar24 <= 60.0) {
      if (local_44[0] == 0) {
        pcVar14 = "The red flag was captured by \'%s\' (%.2f seconds)";
      }
      else {
        pcVar14 = "The blue flag was captured by \'%s\' (%.2f seconds)";
      }
      pcVar14 = Localize(pcVar14,"");
      str_format((char *)&local_148,0x100,pcVar14,SUB84((double)fVar24,0));
    }
    else {
      if (local_44[0] == 0) {
        pcVar14 = "The red flag was captured by \'%s\'";
      }
      else {
        pcVar14 = "The blue flag was captured by \'%s\'";
      }
      pcVar14 = Localize(pcVar14,"");
      str_format((char *)&local_148,0x100,pcVar14);
    }
    pCVar21 = this->m_pChat;
    goto LAB_00182c4c;
  case 10:
    uVar7 = 0x3f;
    if ((int)local_44[0] < 0x3f) {
      uVar7 = local_44[0];
    }
    if ((int)uVar7 < 1) {
      uVar7 = 0;
    }
    GetPlayerLabel(this,local_188,0x40,uVar7,this->m_aClients[uVar7].m_aName);
    pcVar14 = Localize("\'%s\' initiated a pause","");
    str_format((char *)&local_148,0x100,pcVar14);
    pCVar21 = this->m_pChat;
LAB_00182c4c:
    CChat::AddLine(pCVar21,(char *)&local_148,-1,0,-1);
    goto switchD_00181e92_caseD_5;
  }
  CSounds::Enqueue(this_01,3,iVar6);
switchD_00181e92_caseD_5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00182c8a:
  __stack_chk_fail();
}

Assistant:

void CGameClient::OnMessage(int MsgId, CUnpacker *pUnpacker)
{
	Client()->RecordGameMessage(true);

	// special messages
	if(MsgId == NETMSGTYPE_SV_TUNEPARAMS && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		// unpack the new tuning
		CTuningParams NewTuning;
		int *pParams = (int *)&NewTuning;
		for(unsigned i = 0; i < sizeof(CTuningParams)/sizeof(int); i++)
			pParams[i] = pUnpacker->GetInt();

		// check for unpacking errors
		if(pUnpacker->Error())
			return;

		m_ServerMode = SERVERMODE_PURE;

		// apply new tuning
		m_Tuning = NewTuning;
		return;
	}
	else if(MsgId == NETMSGTYPE_SV_VOTEOPTIONLISTADD)
	{
		int NumOptions = pUnpacker->GetInt();
		for(int i = 0; i < NumOptions; i++)
		{
			const char *pDescription = pUnpacker->GetString(CUnpacker::SANITIZE_CC);
			if(pUnpacker->Error())
				return;

			m_pVoting->AddOption(pDescription);
		}
	}
	else if(MsgId == NETMSGTYPE_SV_GAMEMSG)
	{
		int GameMsgID = pUnpacker->GetInt();

		// check for valid gamemsgid
		if(GameMsgID < 0 || GameMsgID >= NUM_GAMEMSGS)
			return;

		int aParaI[3];
		int NumParaI = 0;

		// get paras
		switch(gs_GameMsgList[GameMsgID].m_ParaType)
		{
		case PARA_I: NumParaI = 1; break;
		case PARA_II: NumParaI = 2; break;
		case PARA_III: NumParaI = 3; break;
		}
		for(int i = 0; i < NumParaI; i++)
		{
			aParaI[i] = pUnpacker->GetInt();
		}

		// check for unpacking errors
		if(pUnpacker->Error())
			return;

		// handle special messages
		char aBuf[256];
		bool TeamPlay = m_GameInfo.m_GameFlags&GAMEFLAG_TEAMS;
		if(gs_GameMsgList[GameMsgID].m_Action == DO_SPECIAL)
		{
			switch(GameMsgID)
			{
			case GAMEMSG_CTF_DROP:
				m_pSounds->Enqueue(CSounds::CHN_GLOBAL, SOUND_CTF_DROP);
				break;
			case GAMEMSG_CTF_RETURN:
				m_pSounds->Enqueue(CSounds::CHN_GLOBAL, SOUND_CTF_RETURN);
				break;
			case GAMEMSG_TEAM_ALL:
				{
					const char *pMsg = "";
					switch(GetStrTeam(aParaI[0], TeamPlay))
					{
					case STR_TEAM_GAME: pMsg = Localize("All players were moved to the game"); break;
					case STR_TEAM_RED: pMsg = Localize("All players were moved to the red team"); break;
					case STR_TEAM_BLUE: pMsg = Localize("All players were moved to the blue team"); break;
					case STR_TEAM_SPECTATORS: pMsg = Localize("All players were moved to the spectators"); break;
					}
					m_pBroadcast->DoClientBroadcast(pMsg);
				}
				break;
			case GAMEMSG_TEAM_BALANCE_VICTIM:
				{
					const char *pMsg = "";
					switch(GetStrTeam(aParaI[0], TeamPlay))
					{
					case STR_TEAM_RED: pMsg = Localize("You were moved to the red team due to team balancing"); break;
					case STR_TEAM_BLUE: pMsg = Localize("You were moved to the blue team due to team balancing"); break;
					}
					m_pBroadcast->DoClientBroadcast(pMsg);
				}
				break;
			case GAMEMSG_CTF_GRAB:
				if(m_LocalClientID != -1 && (m_aClients[m_LocalClientID].m_Team != aParaI[0] || (m_Snap.m_SpecInfo.m_Active &&
								((m_Snap.m_SpecInfo.m_SpectatorID != -1 && m_aClients[m_Snap.m_SpecInfo.m_SpectatorID].m_Team != aParaI[0]) ||
								(m_Snap.m_SpecInfo.m_SpecMode == SPEC_FLAGRED && aParaI[0] != TEAM_RED) ||
								(m_Snap.m_SpecInfo.m_SpecMode == SPEC_FLAGBLUE && aParaI[0] != TEAM_BLUE)))))
					m_pSounds->Enqueue(CSounds::CHN_GLOBAL, SOUND_CTF_GRAB_PL);
				else
					m_pSounds->Enqueue(CSounds::CHN_GLOBAL, SOUND_CTF_GRAB_EN);
				break;
			case GAMEMSG_GAME_PAUSED:
				{
					int ClientID = clamp(aParaI[0], 0, MAX_CLIENTS - 1);
					char aLabel[64];
					GetPlayerLabel(aLabel, sizeof(aLabel), ClientID, m_aClients[ClientID].m_aName);
					str_format(aBuf, sizeof(aBuf), Localize("'%s' initiated a pause"), aLabel);
					m_pChat->AddLine(aBuf);
				}
				break;
			case GAMEMSG_CTF_CAPTURE:
				m_pSounds->Enqueue(CSounds::CHN_GLOBAL, SOUND_CTF_CAPTURE);
				int ClientID = clamp(aParaI[1], 0, MAX_CLIENTS - 1);
				m_pStats->OnFlagCapture(ClientID);
				char aLabel[64];
				GetPlayerLabel(aLabel, sizeof(aLabel), ClientID, m_aClients[ClientID].m_aName);

				float Time = aParaI[2] / (float)Client()->GameTickSpeed();
				if(Time <= 60)
				{
					if(aParaI[0])
					{
						str_format(aBuf, sizeof(aBuf), Localize("The blue flag was captured by '%s' (%.2f seconds)"), aLabel, Time);
					}
					else
					{
						str_format(aBuf, sizeof(aBuf), Localize("The red flag was captured by '%s' (%.2f seconds)"), aLabel, Time);
					}
				}
				else
				{
					if(aParaI[0])
					{
						str_format(aBuf, sizeof(aBuf), Localize("The blue flag was captured by '%s'"), aLabel);
					}
					else
					{
						str_format(aBuf, sizeof(aBuf), Localize("The red flag was captured by '%s'"), aLabel);
					}
				}
				m_pChat->AddLine(aBuf);
			}
			return;
		}

		// build message
		const char *pText = "";
		if(NumParaI == 0)
		{
			pText = Localize(gs_GameMsgList[GameMsgID].m_pText);
		}

		// handle message
		switch(gs_GameMsgList[GameMsgID].m_Action)
		{
		case DO_CHAT:
			m_pChat->AddLine(pText);
			break;
		case DO_BROADCAST:
			m_pBroadcast->DoClientBroadcast(pText);
			break;
		}
	}

	void *pRawMsg = m_NetObjHandler.SecureUnpackMsg(MsgId, pUnpacker);
	if(!pRawMsg)
	{
		char aBuf[256];
		str_format(aBuf, sizeof(aBuf), "dropped weird message '%s' (%d), failed on '%s'", m_NetObjHandler.GetMsgName(MsgId), MsgId, m_NetObjHandler.FailedMsgOn());
		Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", aBuf);
		return;
	}

	// TODO: this should be done smarter
	for(int i = 0; i < m_All.m_Num; i++)
		m_All.m_paComponents[i]->OnMessage(MsgId, pRawMsg);

	if(MsgId == NETMSGTYPE_SV_CLIENTINFO && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		CNetMsg_Sv_ClientInfo *pMsg = (CNetMsg_Sv_ClientInfo *)pRawMsg;

		if(pMsg->m_Local)
		{
			if(m_LocalClientID != -1)
			{
				if(Config()->m_Debug)
					Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", "invalid local clientinfo");
				return;
			}
			m_LocalClientID = pMsg->m_ClientID;
			m_TeamChangeTime = Client()->LocalTime();
		}
		else
		{
			if(m_aClients[pMsg->m_ClientID].m_Active)
			{
				if(Config()->m_Debug)
					Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", "invalid clientinfo");
				return;
			}

			if(m_LocalClientID != -1 && !pMsg->m_Silent)
			{
				DoEnterMessage(pMsg->m_pName, pMsg->m_ClientID, pMsg->m_Team);

				if(m_pDemoRecorder->IsRecording())
				{
					CNetMsg_De_ClientEnter Msg;
					Msg.m_pName = pMsg->m_pName;
					Msg.m_ClientID = pMsg->m_ClientID;
					Msg.m_Team = pMsg->m_Team;
					Client()->SendPackMsg(&Msg, MSGFLAG_NOSEND|MSGFLAG_RECORD);
				}
			}
		}

		m_aClients[pMsg->m_ClientID].m_Active = true;
		m_aClients[pMsg->m_ClientID].m_Team  = pMsg->m_Team;
		str_utf8_copy_num(m_aClients[pMsg->m_ClientID].m_aName, pMsg->m_pName, sizeof(m_aClients[pMsg->m_ClientID].m_aName), MAX_NAME_LENGTH);
		str_utf8_copy_num(m_aClients[pMsg->m_ClientID].m_aClan, pMsg->m_pClan, sizeof(m_aClients[pMsg->m_ClientID].m_aClan), MAX_CLAN_LENGTH);
		m_aClients[pMsg->m_ClientID].m_Country = pMsg->m_Country;
		for(int i = 0; i < NUM_SKINPARTS; i++)
		{
			str_utf8_copy_num(m_aClients[pMsg->m_ClientID].m_aaSkinPartNames[i], pMsg->m_apSkinPartNames[i], sizeof(m_aClients[pMsg->m_ClientID].m_aaSkinPartNames[i]), MAX_SKIN_LENGTH);
			m_aClients[pMsg->m_ClientID].m_aUseCustomColors[i] = pMsg->m_aUseCustomColors[i];
			m_aClients[pMsg->m_ClientID].m_aSkinPartColors[i] = pMsg->m_aSkinPartColors[i];
		}

		// update friend state
		m_aClients[pMsg->m_ClientID].m_Friend = Friends()->IsFriend(m_aClients[pMsg->m_ClientID].m_aName, m_aClients[pMsg->m_ClientID].m_aClan, true);
		// update chat ignore state
		m_aClients[pMsg->m_ClientID].m_ChatIgnore = Blacklist()->IsIgnored(m_aClients[pMsg->m_ClientID].m_aName, m_aClients[pMsg->m_ClientID].m_aClan, true);
		if(m_aClients[pMsg->m_ClientID].m_ChatIgnore)
		{
			char aBuf[128];
			char aLabel[64];
			GetPlayerLabel(aLabel, sizeof(aLabel), pMsg->m_ClientID, m_aClients[pMsg->m_ClientID].m_aName);
			str_format(aBuf, sizeof(aBuf), Localize("%s is muted by you"), aLabel);
			m_pChat->AddLine(aBuf, CChat::CLIENT_MSG);
		}

		m_aClients[pMsg->m_ClientID].UpdateRenderInfo(this, pMsg->m_ClientID, true);

		m_GameInfo.m_NumPlayers++;
		// calculate team-balance
		if(m_aClients[pMsg->m_ClientID].m_Team != TEAM_SPECTATORS)
			m_GameInfo.m_aTeamSize[m_aClients[pMsg->m_ClientID].m_Team]++;

		m_pStats->OnPlayerEnter(pMsg->m_ClientID, pMsg->m_Team);
	}
	else if(MsgId == NETMSGTYPE_SV_CLIENTDROP && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		CNetMsg_Sv_ClientDrop *pMsg = (CNetMsg_Sv_ClientDrop *)pRawMsg;

		if(m_LocalClientID == pMsg->m_ClientID || !m_aClients[pMsg->m_ClientID].m_Active)
		{
			if(Config()->m_Debug)
				Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", "invalid clientdrop");
			return;
		}

		if(!pMsg->m_Silent)
		{
			DoLeaveMessage(m_aClients[pMsg->m_ClientID].m_aName, pMsg->m_ClientID, pMsg->m_pReason);

			CNetMsg_De_ClientLeave Msg;
			Msg.m_pName = m_aClients[pMsg->m_ClientID].m_aName;
			Msg.m_ClientID = pMsg->m_ClientID;
			Msg.m_pReason = pMsg->m_pReason;
			Client()->SendPackMsg(&Msg, MSGFLAG_NOSEND | MSGFLAG_RECORD);
		}

		m_GameInfo.m_NumPlayers--;
		// calculate team-balance
		if(m_aClients[pMsg->m_ClientID].m_Team != TEAM_SPECTATORS)
			m_GameInfo.m_aTeamSize[m_aClients[pMsg->m_ClientID].m_Team]--;

		m_aClients[pMsg->m_ClientID].Reset(this, pMsg->m_ClientID);
		m_pStats->OnPlayerLeave(pMsg->m_ClientID);
	}
	else if(MsgId == NETMSGTYPE_SV_SKINCHANGE && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		CNetMsg_Sv_SkinChange *pMsg = (CNetMsg_Sv_SkinChange *)pRawMsg;

		if(!m_aClients[pMsg->m_ClientID].m_Active)
		{
			if(Config()->m_Debug)
				Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", "invalid skin info");
			return;
		}

		for(int i = 0; i < NUM_SKINPARTS; i++)
		{
			str_utf8_copy_num(m_aClients[pMsg->m_ClientID].m_aaSkinPartNames[i], pMsg->m_apSkinPartNames[i], sizeof(m_aClients[pMsg->m_ClientID].m_aaSkinPartNames[i]), MAX_SKIN_LENGTH);
			m_aClients[pMsg->m_ClientID].m_aUseCustomColors[i] = pMsg->m_aUseCustomColors[i];
			m_aClients[pMsg->m_ClientID].m_aSkinPartColors[i] = pMsg->m_aSkinPartColors[i];
		}
		m_aClients[pMsg->m_ClientID].UpdateRenderInfo(this, pMsg->m_ClientID, true);
	}
	else if(MsgId == NETMSGTYPE_SV_GAMEINFO && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		CNetMsg_Sv_GameInfo *pMsg = (CNetMsg_Sv_GameInfo *)pRawMsg;

		m_GameInfo.m_GameFlags = pMsg->m_GameFlags;
		m_GameInfo.m_ScoreLimit = pMsg->m_ScoreLimit;
		m_GameInfo.m_TimeLimit = pMsg->m_TimeLimit;
		m_GameInfo.m_MatchNum = pMsg->m_MatchNum;
		m_GameInfo.m_MatchCurrent = pMsg->m_MatchCurrent;
	}
	else if(MsgId == NETMSGTYPE_SV_SERVERSETTINGS && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		CNetMsg_Sv_ServerSettings *pMsg = (CNetMsg_Sv_ServerSettings *)pRawMsg;

		if(!m_ServerSettings.m_TeamLock && pMsg->m_TeamLock)
			m_pChat->AddLine(Localize("Teams were locked"));
		else if(m_ServerSettings.m_TeamLock && !pMsg->m_TeamLock)
			m_pChat->AddLine(Localize("Teams were unlocked"));

		m_ServerSettings.m_KickVote = pMsg->m_KickVote;
		m_ServerSettings.m_KickMin = pMsg->m_KickMin;
		m_ServerSettings.m_SpecVote = pMsg->m_SpecVote;
		m_ServerSettings.m_TeamLock = pMsg->m_TeamLock;
		m_ServerSettings.m_TeamBalance = pMsg->m_TeamBalance;
		m_ServerSettings.m_PlayerSlots = pMsg->m_PlayerSlots;
	}
	else if(MsgId == NETMSGTYPE_SV_TEAM)
	{
		CNetMsg_Sv_Team *pMsg = (CNetMsg_Sv_Team *)pRawMsg;

		if(Client()->State() != IClient::STATE_DEMOPLAYBACK)
		{
			// calculate team-balance
			if(m_aClients[pMsg->m_ClientID].m_Team != TEAM_SPECTATORS)
				m_GameInfo.m_aTeamSize[m_aClients[pMsg->m_ClientID].m_Team]--;
			m_aClients[pMsg->m_ClientID].m_Team = pMsg->m_Team;
			if(m_aClients[pMsg->m_ClientID].m_Team != TEAM_SPECTATORS)
				m_GameInfo.m_aTeamSize[m_aClients[pMsg->m_ClientID].m_Team]++;

			m_aClients[pMsg->m_ClientID].UpdateRenderInfo(this, pMsg->m_ClientID, false);

			if(pMsg->m_ClientID == m_LocalClientID)
			{
				m_TeamCooldownTick = pMsg->m_CooldownTick;
				m_TeamChangeTime = Client()->LocalTime();
			}
		}

		if(pMsg->m_Silent == 0)
		{
			DoTeamChangeMessage(m_aClients[pMsg->m_ClientID].m_aName, pMsg->m_ClientID, pMsg->m_Team);
		}
	}
	else if(MsgId == NETMSGTYPE_SV_READYTOENTER)
	{
		Client()->EnterGame();
	}
	else if (MsgId == NETMSGTYPE_SV_EMOTICON)
	{
		CNetMsg_Sv_Emoticon *pMsg = (CNetMsg_Sv_Emoticon *)pRawMsg;

		// apply
		m_aClients[pMsg->m_ClientID].m_Emoticon = pMsg->m_Emoticon;
		m_aClients[pMsg->m_ClientID].m_EmoticonStart = Client()->GameTick();
	}
	else if(MsgId == NETMSGTYPE_DE_CLIENTENTER && Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		CNetMsg_De_ClientEnter *pMsg = (CNetMsg_De_ClientEnter *)pRawMsg;
		DoEnterMessage(pMsg->m_pName, pMsg->m_ClientID, pMsg->m_Team);
		m_pStats->OnPlayerEnter(pMsg->m_ClientID, pMsg->m_Team);
	}
	else if(MsgId == NETMSGTYPE_DE_CLIENTLEAVE && Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		CNetMsg_De_ClientLeave *pMsg = (CNetMsg_De_ClientLeave *)pRawMsg;
		DoLeaveMessage(pMsg->m_pName, pMsg->m_ClientID, pMsg->m_pReason);
		m_pStats->OnPlayerLeave(pMsg->m_ClientID);
	}
}